

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void cm_zlib__tr_stored_block(deflate_state *s,charf *buf,ulg stored_len,int eof)

{
  Bytef BVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  
  iVar4 = s->bi_valid;
  uVar6 = (ushort)(eof << ((byte)iVar4 & 0x1f)) | s->bi_buf;
  s->bi_buf = uVar6;
  if (iVar4 < 0xe) {
    iVar4 = iVar4 + 3;
  }
  else {
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)uVar6;
    BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = BVar1;
    s->bi_buf = (ush)((eof & 0xffffU) >> (0x10U - (char)s->bi_valid & 0x1f));
    iVar4 = s->bi_valid + -0xd;
  }
  s->bi_valid = iVar4;
  bi_windup(s);
  s->last_eob_len = 8;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)stored_len;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)(stored_len >> 8);
  uVar5 = (uint)stored_len;
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)(uVar5 ^ 0xffff);
  uVar2 = s->pending;
  s->pending = uVar2 + 1;
  s->pending_buf[uVar2] = (Bytef)((uVar5 ^ 0xffff) >> 8);
  if (uVar5 != 0) {
    lVar3 = 0;
    do {
      BVar1 = buf[lVar3];
      uVar2 = s->pending;
      s->pending = uVar2 + 1;
      s->pending_buf[uVar2] = BVar1;
      lVar3 = lVar3 + 1;
    } while (uVar5 != (uint)lVar3);
  }
  return;
}

Assistant:

void _tr_stored_block(s, buf, stored_len, eof)
    deflate_state *s;
    charf *buf;       /* input block */
    ulg stored_len;   /* length of input block */
    int eof;          /* true if this is the last block for a file */
{
    send_bits(s, (STORED_BLOCK<<1)+eof, 3);  /* send block type */
#ifdef DEBUG
    s->compressed_len = (s->compressed_len + 3 + 7) & (ulg)~7L;
    s->compressed_len += (stored_len + 4) << 3;
#endif
    copy_block(s, buf, (unsigned)stored_len, 1); /* with header */
}